

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_last.c
# Opt level: O0

int mpt_path_last(mpt_path *path)

{
  byte bVar1;
  char *pcVar2;
  int *piVar3;
  bool bVar4;
  ulong local_30;
  size_t pos;
  size_t len;
  char *data;
  mpt_path *path_local;
  
  local_30 = path->len;
  if ((local_30 == 0) || (pcVar2 = path->base, pcVar2 == (char *)0x0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    path_local._4_4_ = 0xfffffffe;
  }
  else if ((path->flags & 0x80) == 0) {
    len = (size_t)(pcVar2 + (local_30 - 2));
    pos = 0;
    while( true ) {
      local_30 = local_30 - 1;
      bVar4 = false;
      if (local_30 != 0) {
        bVar4 = *(char *)len != path->sep;
      }
      if (!bVar4) break;
      len = len - 1;
      pos = pos + 1;
    }
    path->off = local_30 + path->off;
    path->first = (uint8_t)pos;
    path_local._4_4_ = (uint)pos;
    path->len = (long)(int)((path_local._4_4_ & 0xff) + 1);
  }
  else if ((local_30 < 2) || (bVar1 = pcVar2[local_30 - 2], local_30 < (ulong)(long)(char)bVar1)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    path_local._4_4_ = 0xfffffffe;
  }
  else {
    path->off = (local_30 - (long)(char)bVar1) + path->off;
    path->first = bVar1;
    path->len = (long)(int)(bVar1 + 2);
    path_local._4_4_ = (uint)(char)bVar1;
  }
  return path_local._4_4_;
}

Assistant:

extern int mpt_path_last(MPT_STRUCT(path) *path)
{
	const char *data;
	size_t len, pos;
	
	if (!(pos = path->len) || !(data = path->base)) {
		errno = EINVAL; return -2;
	}
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		if (pos < 2 || pos < (len = data[pos-2])) {
			errno = EINVAL; return -2;
		}
		pos -= len;
		
		path->off += pos;
		path->len  = (path->first = len) + 2;
		
		return len;
	}
	
	data += (--pos - 1);
	len = 0;
	
	/* find last separator */
	while (pos && *data != path->sep) {
		--data; ++len; --pos;
	}
	path->off += pos;
	path->len  = (path->first = len) + 1;
	
	return len;
}